

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_3::IsSupportGuaranteedOpenCL_1_2
               (uint32_t capability,bool embedded_profile)

{
  bool embedded_profile_local;
  uint32_t capability_local;
  
  if (4 < capability - 4) {
    if (capability == 0xb) {
      return (bool)((embedded_profile ^ 0xffU) & 1);
    }
    if ((capability != 0x16) && (capability != 0x27)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool IsSupportGuaranteedOpenCL_1_2(uint32_t capability, bool embedded_profile) {
  switch (spv::Capability(capability)) {
    case spv::Capability::Addresses:
    case spv::Capability::Float16Buffer:
    case spv::Capability::Int16:
    case spv::Capability::Int8:
    case spv::Capability::Kernel:
    case spv::Capability::Linkage:
    case spv::Capability::Vector16:
      return true;
    case spv::Capability::Int64:
      return !embedded_profile;
    default:
      break;
  }
  return false;
}